

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void OPN2_DoTimerA(ym3438_t *chip)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  
  bVar1 = chip->timer_a_overflow;
  bVar3 = bVar1;
  if (chip->cycles == 2) {
    bVar5 = false;
    if (chip->timer_a_load_lock == '\0') {
      bVar5 = chip->timer_a_load != '\0';
    }
    bVar3 = bVar5 | bVar1;
    chip->timer_a_load_lock = chip->timer_a_load;
    bVar4 = bVar3;
    if (chip->mode_csm == '\0') {
      bVar4 = 0;
    }
    chip->mode_kon_csm = bVar4;
  }
  uVar2 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
  chip->timer_a_load_latch = bVar3;
  if (((chip->cycles == 1) && (chip->timer_a_load_lock != '\0')) || (chip->mode_test_21[2] != '\0'))
  {
    uVar2 = uVar2 + 1;
  }
  if (chip->timer_a_reset == '\0') {
    chip->timer_a_overflow_flag = chip->timer_a_overflow_flag | bVar1 & chip->timer_a_enable;
  }
  else {
    chip->timer_a_reset = '\0';
    chip->timer_a_overflow_flag = '\0';
  }
  chip->timer_a_overflow = (byte)(uVar2 >> 10);
  chip->timer_a_cnt = uVar2 & 0x3ff;
  return;
}

Assistant:

void OPN2_DoTimerA(ym3438_t *chip)
{
    Bit16u time;
    Bit8u load;
    load = chip->timer_a_overflow;
    if (chip->cycles == 2)
    {
        /* Lock load value */
        load |= (!chip->timer_a_load_lock && chip->timer_a_load);
        chip->timer_a_load_lock = chip->timer_a_load;
        if (chip->mode_csm)
        {
            /* CSM KeyOn */
            chip->mode_kon_csm = load;
        }
        else
        {
            chip->mode_kon_csm = 0;
        }
    }
    /* Load counter */
    if (chip->timer_a_load_latch)
    {
        time = chip->timer_a_reg;
    }
    else
    {
        time = chip->timer_a_cnt;
    }
    chip->timer_a_load_latch = load;
    /* Increase counter */
    if ((chip->cycles == 1 && chip->timer_a_load_lock) || chip->mode_test_21[2])
    {
        time++;
    }
    /* Set overflow flag */
    if (chip->timer_a_reset)
    {
        chip->timer_a_reset = 0;
        chip->timer_a_overflow_flag = 0;
    }
    else
    {
        chip->timer_a_overflow_flag |= chip->timer_a_overflow & chip->timer_a_enable;
    }
    chip->timer_a_overflow = (time >> 10);
    chip->timer_a_cnt = time & 0x3ff;
}